

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O3

void read_exp(ifstream *f,string *buf)

{
  undefined8 in_RAX;
  int iVar1;
  char c;
  char local_21;
  
  std::istream::get((char *)f);
  local_21 = (char)((ulong)in_RAX >> 0x38);
  if (local_21 != '(') {
    iVar1 = *(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20);
    while ((iVar1 == 0 && (std::istream::get((char *)f), local_21 != '('))) {
      iVar1 = *(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20);
    }
  }
  std::__cxx11::string::push_back((char)buf);
  if (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) == 0) {
    iVar1 = 1;
    do {
      std::istream::get((char *)f);
      std::__cxx11::string::push_back((char)buf);
      if (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) != 0) {
        return;
      }
      iVar1 = (iVar1 - (uint)(local_21 == ')')) + (uint)(local_21 == '(');
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void read_exp(std::ifstream &f, std::string &buf) {

  char c;

  f.get(c);
  while (c!='(' && f.good()) f.get(c);

  buf.push_back(c);
  int stack = 1;

  while (f.good() && stack) {

    f.get(c);
    buf += c;

    if (c==')') stack--;
    if (c=='(') stack++;

  }

}